

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlLoadCatalog(void)

{
  int val;
  char *val_00;
  undefined4 local_1c;
  int n_filename;
  char *filename;
  int ret_val;
  int test_ret;
  
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    val_00 = gen_filepath(local_1c,0);
    val = xmlLoadCatalog(val_00);
    desret_int(val);
    call_tests = call_tests + 1;
    des_filepath(local_1c,val_00,0);
    xmlResetLastError();
  }
  function_tests = function_tests + 1;
  return 0;
}

Assistant:

static int
test_xmlLoadCatalog(void) {
    int test_ret = 0;

#if defined(LIBXML_CATALOG_ENABLED)
    int ret_val;
    const char * filename; /* a file path */
    int n_filename;

    for (n_filename = 0;n_filename < gen_nb_filepath;n_filename++) {
        filename = gen_filepath(n_filename, 0);

        ret_val = xmlLoadCatalog(filename);
        desret_int(ret_val);
        call_tests++;
        des_filepath(n_filename, filename, 0);
        xmlResetLastError();
    }
    function_tests++;
#endif

    return(test_ret);
}